

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crop_file.cpp
# Opt level: O2

int main(int nargs,char **args)

{
  istream *piVar1;
  ostream *poVar2;
  pointer pbVar3;
  string riga;
  double tf;
  double ti;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  nomi;
  string f;
  string folderout;
  string folderin;
  string local_5f8;
  double t;
  istringstream istr;
  ofstream ofi;
  ifstream ifi;
  
  std::operator<<((ostream *)&std::cout,"dare gli estremi dell\'intervallo: ");
  piVar1 = std::istream::_M_extract<double>((double *)&std::cin);
  std::istream::_M_extract<double>((double *)piVar1);
  std::__cxx11::string::string((string *)&folderin,args[1],(allocator *)&ifi);
  std::__cxx11::string::string((string *)&local_5f8,(string *)&folderin);
  NomiFiles(&nomi,true,&local_5f8);
  std::__cxx11::string::~string((string *)&local_5f8);
  std::operator+(&folderout,&folderin,"\\crop");
  MakeFolder(folderout._M_dataplus._M_p);
  pbVar3 = nomi.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  do {
    if (pbVar3 == nomi.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish) {
      std::__cxx11::string::~string((string *)&folderout);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&nomi);
      std::__cxx11::string::~string((string *)&folderin);
      return 0;
    }
    std::__cxx11::string::string((string *)&f,(string *)pbVar3);
    std::operator+(&riga,&folderin,"\\");
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&istr,&riga,
                   &f);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&ofi,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&istr,".txt"
                  );
    std::ifstream::ifstream((istream *)&ifi,(string *)&ofi,_S_in);
    std::__cxx11::string::~string((string *)&ofi);
    std::__cxx11::string::~string((string *)&istr);
    std::__cxx11::string::~string((string *)&riga);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&t,
                   &folderout,"\\");
    std::operator+(&riga,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&t,&f)
    ;
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&istr,&riga,
                   "_crop.txt");
    std::ofstream::ofstream
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&ofi,
               (string *)&istr,_S_out);
    std::__cxx11::string::~string((string *)&istr);
    std::__cxx11::string::~string((string *)&riga);
    std::__cxx11::string::~string((string *)&t);
    riga._M_dataplus._M_p = (pointer)&riga.field_2;
    riga._M_string_length = 0;
    riga.field_2._M_local_buf[0] = '\0';
    while( true ) {
      piVar1 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                         ((istream *)&ifi,(string *)&riga);
      if (((byte)piVar1[*(long *)(*(long *)piVar1 + -0x18) + 0x20] & 5) != 0) break;
      std::__cxx11::istringstream::istringstream((istringstream *)&istr,(string *)&riga,_S_in);
      std::istream::_M_extract<double>((double *)&istr);
      if (ti <= t) {
        if (tf < t) {
          std::__cxx11::istringstream::~istringstream((istringstream *)&istr);
          break;
        }
        poVar2 = std::operator<<((ostream *)&ofi,(string *)&riga);
        std::endl<char,std::char_traits<char>>(poVar2);
      }
      std::__cxx11::istringstream::~istringstream((istringstream *)&istr);
    }
    std::ifstream::close();
    std::ofstream::close();
    std::__cxx11::string::~string((string *)&riga);
    std::ofstream::~ofstream
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&ofi);
    std::ifstream::~ifstream((istream *)&ifi);
    std::__cxx11::string::~string((string *)&f);
    pbVar3 = pbVar3 + 1;
  } while( true );
}

Assistant:

int main(int nargs, char** args) {
	double ti, tf;
	cout << "dare gli estremi dell'intervallo: "; 
	cin >> ti >> tf;

	string folderin(args[1]);
	auto nomi = NomiFiles(true, folderin);

	string folderout = folderin + "\\crop";
	MakeFolder(folderout.c_str());

	for(string f : nomi) {
		ifstream ifi(folderin + "\\" + f + ".txt");
		ofstream ofi(folderout + "\\" + f + "_crop.txt");
		double t;
		string riga;
		while(getline(ifi, riga)) {
			istringstream istr(riga); istr >> t;
			if(t < ti) continue;
			if(t > tf) break;
			ofi << riga << endl;
		};
		ifi.close();
		ofi.close();
	};
}